

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O1

void __thiscall Dependency::Dependency(Dependency *this,string *path,string *dependent_file)

{
  string *prefix;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  ostream *poVar9;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar10;
  undefined8 extraout_RDX_05;
  uint uVar11;
  Settings *this_00;
  string search_path;
  string original_file;
  char original_file_buffer [4096];
  string local_10f8;
  undefined1 *local_10d8;
  char *local_10d0;
  undefined1 local_10c8 [16];
  string *local_10b8;
  string local_10b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1090;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1070;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1068;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1060;
  undefined1 *local_1058 [2];
  undefined1 local_1048 [16];
  char local_1038 [4104];
  
  local_1060 = &(this->filename).field_2;
  (this->filename)._M_dataplus._M_p = (pointer)local_1060;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  prefix = &this->prefix;
  local_1068 = &(this->prefix).field_2;
  (this->prefix)._M_dataplus._M_p = (pointer)local_1068;
  (this->prefix)._M_string_length = 0;
  (this->prefix).field_2._M_local_buf[0] = '\0';
  (this->symlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->symlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->symlinks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_10b8 = (string *)&this->new_name;
  local_1070 = &(this->new_name).field_2;
  (this->new_name)._M_dataplus._M_p = (pointer)local_1070;
  (this->new_name)._M_string_length = 0;
  (this->new_name).field_2._M_local_buf[0] = '\0';
  local_10d8 = local_10c8;
  local_10d0 = (char *)0x0;
  local_10c8[0] = 0;
  rtrim(path);
  bVar4 = isRpath(path);
  if (bVar4) {
    searchFilenameInRpaths(&local_10b0,path,dependent_file);
    std::__cxx11::string::operator=((string *)&local_10d8,(string *)&local_10b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_10b0._M_dataplus._M_p != &local_10b0.field_2) {
      operator_delete(local_10b0._M_dataplus._M_p);
    }
  }
  else {
    rtrim(path);
    pcVar7 = realpath((path->_M_dataplus)._M_p,local_1038);
    pcVar2 = local_10d0;
    if (pcVar7 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\n/!\\ WARNING : Cannot resolve path \'",0x24);
      pcVar2 = (path->_M_dataplus)._M_p;
      if (pcVar2 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x128380);
      }
      else {
        sVar8 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
      std::__cxx11::string::_M_assign((string *)&local_10d8);
    }
    else {
      strlen(local_1038);
      std::__cxx11::string::_M_replace((ulong)&local_10d8,0,pcVar2,(ulong)local_1038);
    }
  }
  if ((local_10d0 != (char *)path->_M_string_length) ||
     ((local_10d0 != (char *)0x0 &&
      (iVar6 = bcmp(local_10d8,(path->_M_dataplus)._M_p,(size_t)local_10d0), iVar6 != 0)))) {
    addSymlink(this,path);
  }
  local_1058[0] = local_1048;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1058,local_10d8,local_10d0 + (long)local_10d8);
  std::__cxx11::string::rfind((char *)local_1058,0x11d812,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_10b0,(ulong)local_1058);
  std::__cxx11::string::operator=((string *)this,(string *)&local_10b0);
  paVar1 = &local_10b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_10b0._M_dataplus._M_p);
  }
  if (local_1058[0] != local_1048) {
    operator_delete(local_1058[0]);
  }
  std::__cxx11::string::rfind((char *)&local_10d8,0x11d812,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_10b0,(ulong)&local_10d8);
  std::__cxx11::string::operator=((string *)prefix,(string *)&local_10b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_10b0._M_dataplus._M_p);
  }
  sVar3 = (this->prefix)._M_string_length;
  if ((sVar3 != 0) && ((prefix->_M_dataplus)._M_p[sVar3 - 1] != '/')) {
    std::__cxx11::string::append((char *)prefix);
  }
  bVar4 = Settings::isPrefixBundled(prefix);
  if (bVar4) {
    if ((this->prefix)._M_string_length == 0) {
      bVar4 = true;
    }
    else {
      std::operator+(&local_10b0,prefix,&this->filename);
      bVar4 = fileExists(&local_10b0);
      bVar4 = !bVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_10b0._M_dataplus._M_p);
      }
    }
    if (bVar4) {
      iVar6 = Settings::searchPathAmount();
      uVar10 = extraout_RDX;
      if (iVar6 == 0) {
        initSearchPaths();
        iVar6 = Settings::searchPathAmount();
        uVar10 = extraout_RDX_00;
      }
      if (0 < iVar6) {
        this_00 = (Settings *)0x0;
        do {
          while( true ) {
            Settings::searchPath_abi_cxx11_(&local_10f8,this_00,(int)uVar10);
            std::operator+(&local_1090,&local_10f8,&this->filename);
            bVar4 = fileExists(&local_1090);
            uVar10 = extraout_RDX_01;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1090._M_dataplus._M_p != &local_1090.field_2) {
              operator_delete(local_1090._M_dataplus._M_p);
              uVar10 = extraout_RDX_02;
            }
            if (!bVar4) break;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FOUND ",6);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(this->filename)._M_dataplus._M_p,
                                (this->filename)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," in ",4);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,local_10f8._M_dataplus._M_p,local_10f8._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            std::__cxx11::string::_M_assign((string *)prefix);
            missing_prefixes = true;
            uVar10 = extraout_RDX_03;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_10f8._M_dataplus._M_p != &local_10f8.field_2) {
              operator_delete(local_10f8._M_dataplus._M_p);
              uVar10 = extraout_RDX_04;
            }
            uVar11 = (int)this_00 + 1;
            this_00 = (Settings *)(ulong)uVar11;
            if (bVar4 || iVar6 <= (int)uVar11) goto LAB_00106456;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_10f8._M_dataplus._M_p != &local_10f8.field_2) {
            operator_delete(local_10f8._M_dataplus._M_p);
            uVar10 = extraout_RDX_05;
          }
          uVar11 = (int)this_00 + 1;
          this_00 = (Settings *)(ulong)uVar11;
        } while ((int)uVar11 < iVar6);
      }
    }
LAB_00106456:
    bVar4 = Settings::isPrefixIgnored(prefix);
    if (bVar4) {
      bVar4 = false;
      bVar5 = false;
    }
    else if ((this->prefix)._M_string_length == 0) {
      bVar5 = true;
      bVar4 = false;
    }
    else {
      std::operator+(&local_10f8,prefix,&this->filename);
      bVar5 = fileExists(&local_10f8);
      bVar5 = !bVar5;
      bVar4 = true;
    }
    if ((bVar4) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_10f8._M_dataplus._M_p != &local_10f8.field_2)) {
      operator_delete(local_10f8._M_dataplus._M_p);
    }
    if (bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\n/!\\ WARNING : Library ",0x17);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(this->filename)._M_dataplus._M_p,
                          (this->filename)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9," has an incomplete name (location unknown)",0x2a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      missing_prefixes = true;
      getUserInputDirForFile(&local_1090,&this->filename);
      Settings::addSearchPath(&local_1090);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1090._M_dataplus._M_p != &local_1090.field_2) {
        operator_delete(local_1090._M_dataplus._M_p);
      }
    }
    std::__cxx11::string::_M_assign(local_10b8);
  }
  if (local_10d8 != local_10c8) {
    operator_delete(local_10d8);
  }
  return;
}

Assistant:

Dependency::Dependency(std::string path, const std::string& dependent_file)
{
    char original_file_buffer[PATH_MAX];
    std::string original_file;

    rtrim(path);
    if (isRpath(path))
    {
        original_file = searchFilenameInRpaths(path, dependent_file);
    }
    else if (realpath(rtrim(path).c_str(), original_file_buffer))
    {
        original_file = original_file_buffer;
    }
    else
    {
        std::cerr << "\n/!\\ WARNING : Cannot resolve path '" << path.c_str() << "'" << std::endl;
        original_file = path;
    }

    // check if given path is a symlink
    if (original_file != path) addSymlink(path);

    filename = stripPrefix(original_file);
    prefix = original_file.substr(0, original_file.rfind("/")+1);
    
    if( !prefix.empty() && prefix[ prefix.size()-1 ] != '/' ) prefix += "/";

    // check if this dependency is in /usr/lib, /System/Library, or in ignored list
    if (!Settings::isPrefixBundled(prefix)) return;

    // check if the lib is in a known location
    if( prefix.empty() || !fileExists( prefix+filename ) )
    {
        //the paths contains at least /usr/lib so if it is empty we have not initialized it
        int searchPathAmount = Settings::searchPathAmount();
        if( searchPathAmount == 0 )
        {
            initSearchPaths();
            searchPathAmount = Settings::searchPathAmount();
        }
        
        //check if file is contained in one of the paths
        for( int i=0; i<searchPathAmount; ++i)
        {
            std::string search_path = Settings::searchPath(i);
            if (fileExists( search_path+filename ))
            {
                std::cout << "FOUND " << filename << " in " << search_path << std::endl;
                prefix = search_path;
                missing_prefixes = true; //the prefix was missing
                break;
            }
        }
    }
    
    //If the location is still unknown, ask the user for search path
    if( !Settings::isPrefixIgnored(prefix)
        && ( prefix.empty() || !fileExists( prefix+filename ) ) )
    {
        std::cerr << "\n/!\\ WARNING : Library " << filename << " has an incomplete name (location unknown)" << std::endl;
        missing_prefixes = true;

        Settings::addSearchPath(getUserInputDirForFile(filename));
    }

    new_name = filename;
}